

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

char * __thiscall tetgenio::findnextnumber(tetgenio *this,char *string)

{
  bool bVar1;
  char *local_20;
  char *result;
  char *string_local;
  tetgenio *this_local;
  
  local_20 = string;
  while( true ) {
    bVar1 = false;
    if ((((*local_20 != '\0') && (bVar1 = false, *local_20 != '#')) &&
        (bVar1 = false, *local_20 != ' ')) && (bVar1 = false, *local_20 != '\t')) {
      bVar1 = *local_20 != ',';
    }
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  while( true ) {
    bVar1 = false;
    if ((((*local_20 != '\0') && (bVar1 = false, *local_20 != '#')) &&
        ((bVar1 = false, *local_20 != '.' &&
         ((bVar1 = false, *local_20 != '+' && (bVar1 = false, *local_20 != '-')))))) &&
       (bVar1 = true, '/' < *local_20)) {
      bVar1 = '9' < *local_20;
    }
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  if (*local_20 == '#') {
    *local_20 = '\0';
  }
  return local_20;
}

Assistant:

char* tetgenio::findnextnumber(char *string)
{
  char *result;

  result = string;
  // Skip the current field.  Stop upon reaching whitespace or a comma.
  while ((*result != '\0') && (*result != '#') && (*result != ' ') && 
         (*result != '\t') && (*result != ',')) {
    result++;
  }
  // Now skip the whitespace and anything else that doesn't look like a
  //   number, a comment, or the end of a line. 
  while ((*result != '\0') && (*result != '#')
         && (*result != '.') && (*result != '+') && (*result != '-')
         && ((*result < '0') || (*result > '9'))) {
    result++;
  }
  // Check for a comment (prefixed with `#').
  if (*result == '#') {
    *result = '\0';
  }
  return result;
}